

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

char * __thiscall
rapidxml::memory_pool<char>::allocate_string(memory_pool<char> *this,char *source,size_t size)

{
  char *pcVar1;
  size_t i;
  size_t sVar2;
  
  if (source != (char *)0x0 || size != 0) {
    if (size == 0) {
      sVar2 = 0;
      do {
        size = sVar2 + 1;
        pcVar1 = source + sVar2;
        sVar2 = size;
      } while (*pcVar1 != '\0');
    }
    pcVar1 = (char *)allocate_aligned(this,size);
    if (size != 0 && source != (char *)0x0) {
      sVar2 = 0;
      do {
        pcVar1[sVar2] = source[sVar2];
        sVar2 = sVar2 + 1;
      } while (size != sVar2);
    }
    return pcVar1;
  }
  __assert_fail("source || size",
                "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidxml/rapidxml.hpp"
                ,0x1de,
                "Ch *rapidxml::memory_pool<>::allocate_string(const Ch *, std::size_t) [Ch = char]")
  ;
}

Assistant:

Ch *allocate_string(const Ch *source = 0, std::size_t size = 0)
        {
            assert(source || size);     // Either source or size (or both) must be specified
            if (size == 0)
                size = internal::measure(source) + 1;
            Ch *result = static_cast<Ch *>(allocate_aligned(size * sizeof(Ch)));
            if (source)
                for (std::size_t i = 0; i < size; ++i)
                    result[i] = source[i];
            return result;
        }